

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx,X509_STORE *store)

{
  bssl::check_ssl_ctx_x509_method(ctx);
  set_cert_store(&((ctx->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl)->verify_store,store,0);
  return 1;
}

Assistant:

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx, X509_STORE *store) {
  check_ssl_ctx_x509_method(ctx);
  return set_cert_store(&ctx->cert->verify_store, store, 0);
}